

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numbering.h
# Opt level: O2

Index __thiscall wasm::ValueNumbering::getValue(ValueNumbering *this,Literals *lit)

{
  iterator iVar1;
  mapped_type *pmVar2;
  Index IVar3;
  
  iVar1 = std::
          _Hashtable<wasm::Literals,_std::pair<const_wasm::Literals,_unsigned_int>,_std::allocator<std::pair<const_wasm::Literals,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Literals>,_std::hash<wasm::Literals>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->literalValues)._M_h,lit);
  if (iVar1.super__Node_iterator_base<std::pair<const_wasm::Literals,_unsigned_int>,_true>._M_cur ==
      (__node_type *)0x0) {
    IVar3 = this->nextValue;
    this->nextValue = IVar3 + 1;
    pmVar2 = std::__detail::
             _Map_base<wasm::Literals,_std::pair<const_wasm::Literals,_unsigned_int>,_std::allocator<std::pair<const_wasm::Literals,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Literals>,_std::hash<wasm::Literals>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<wasm::Literals,_std::pair<const_wasm::Literals,_unsigned_int>,_std::allocator<std::pair<const_wasm::Literals,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Literals>,_std::hash<wasm::Literals>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&this->literalValues,lit);
    *pmVar2 = IVar3;
  }
  else {
    IVar3 = *(Index *)((long)iVar1.
                             super__Node_iterator_base<std::pair<const_wasm::Literals,_unsigned_int>,_true>
                             ._M_cur + 0x40);
  }
  return IVar3;
}

Assistant:

Index getValue(Literals lit) {
    auto iter = literalValues.find(lit);
    if (iter != literalValues.end()) {
      return iter->second;
    }
    return literalValues[lit] = getUniqueValue();
  }